

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

bool __thiscall Potassco::SmodelsInput::readRules(SmodelsInput *this)

{
  long in_RDI;
  Atom_t rHead;
  uint i;
  uint rt;
  Weight_t minPrio;
  RuleBuilder rule;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  bool cnd;
  ProgramReader *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  Atom_t in_stack_ffffffffffffff4c;
  SmodelsInput *in_stack_ffffffffffffff50;
  Atom_t in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  Head_t in_stack_ffffffffffffff64;
  uint in_stack_ffffffffffffff68;
  Atom_t in_stack_ffffffffffffff6c;
  SmodelsInput *in_stack_ffffffffffffff70;
  Value_t local_54;
  Value_t local_50;
  Atom_t local_4c;
  Head_t local_48;
  Head_t local_44;
  Atom_t local_40;
  Head_t local_3c;
  undefined4 local_38;
  uint local_28;
  int local_24;
  AbstractProgram *in_stack_ffffffffffffffe0;
  RuleBuilder *in_stack_ffffffffffffffe8;
  bool local_1;
  
  RuleBuilder::RuleBuilder((RuleBuilder *)in_stack_ffffffffffffff50);
  local_24 = 0;
LAB_00265df4:
  do {
    local_28 = ProgramReader::matchPos
                         (in_stack_ffffffffffffff40,
                          (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (local_28 == 0) {
      local_1 = true;
LAB_002662a4:
      local_38 = 1;
      RuleBuilder::~RuleBuilder((RuleBuilder *)in_stack_ffffffffffffff40);
      return local_1;
    }
    RuleBuilder::clear((RuleBuilder *)in_stack_ffffffffffffff40);
    if (local_28 != 1) {
      if (local_28 != 2) {
        if (local_28 != 3) {
          if (local_28 == 5) goto LAB_00266058;
          if (local_28 == 6) {
            local_24 = local_24 + 1;
            RuleBuilder::startMinimize
                      ((RuleBuilder *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
            matchSum(in_stack_ffffffffffffff70,
                     (RuleBuilder *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     SUB41(in_stack_ffffffffffffff64.val_ >> 0x18,0));
            RuleBuilder::end(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
            goto LAB_00265df4;
          }
          if (local_28 != 8) {
            if (local_28 == 0x5a) {
              in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 & 0xffffff;
              if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
                in_stack_ffffffffffffff64.val_ =
                     ProgramReader::matchPos
                               (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(char *)0x26616a
                               );
                in_stack_ffffffffffffff68 =
                     CONCAT13(in_stack_ffffffffffffff64.val_ == Disjunctive,
                              (int3)in_stack_ffffffffffffff68);
              }
              ProgramReader::require
                        (in_stack_ffffffffffffff40,SUB41(in_stack_ffffffffffffff3c >> 0x18,0),
                         (char *)0x266199);
            }
            else {
              cnd = SUB41(in_stack_ffffffffffffff3c >> 0x18,0);
              if (1 < local_28 - 0x5b) {
                local_1 = ProgramReader::require(in_stack_ffffffffffffff40,cnd,(char *)0x265ee5);
                goto LAB_002662a4;
              }
              ProgramReader::require(in_stack_ffffffffffffff40,cnd,(char *)0x2661b8);
              if (local_28 == 0x5b) {
                in_stack_ffffffffffffff58 =
                     ProgramReader::matchAtom
                               (in_stack_ffffffffffffff40,
                                (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ));
                in_stack_ffffffffffffff50 = *(SmodelsInput **)(in_RDI + 0x18);
                local_4c = in_stack_ffffffffffffff58;
                in_stack_ffffffffffffff5c =
                     ProgramReader::matchPos
                               (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,(char *)0x26620a
                               );
                Value_t::Value_t(&local_50,(in_stack_ffffffffffffff5c ^ 3) - 1);
                (*(in_stack_ffffffffffffff50->super_ProgramReader)._vptr_ProgramReader[9])
                          (in_stack_ffffffffffffff50,(ulong)in_stack_ffffffffffffff58,
                           (ulong)local_50.val_);
              }
              else {
                in_stack_ffffffffffffff40 = *(ProgramReader **)(in_RDI + 0x18);
                in_stack_ffffffffffffff4c =
                     ProgramReader::matchAtom
                               (in_stack_ffffffffffffff40,
                                (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
                                                ));
                Value_t::Value_t(&local_54,Release);
                (*in_stack_ffffffffffffff40->_vptr_ProgramReader[9])
                          (in_stack_ffffffffffffff40,(ulong)in_stack_ffffffffffffff4c,
                           (ulong)local_54.val_);
              }
            }
            goto LAB_00265df4;
          }
        }
        Head_t::Head_t(&local_3c,(uint)(local_28 == 3));
        RuleBuilder::start((RuleBuilder *)
                           CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           in_stack_ffffffffffffff64);
        local_40 = ProgramReader::matchAtom
                             (in_stack_ffffffffffffff40,
                              (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        while (local_40 != 0) {
          local_40 = local_40 - 1;
          ProgramReader::matchAtom
                    (in_stack_ffffffffffffff40,
                     (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          RuleBuilder::addHead((RuleBuilder *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        }
        local_40 = local_40 - 1;
        matchBody(in_stack_ffffffffffffff50,
                  (RuleBuilder *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        RuleBuilder::end(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
        goto LAB_00265df4;
      }
LAB_00266058:
      Head_t::Head_t(&local_48,Disjunctive);
      in_stack_ffffffffffffff70 =
           (SmodelsInput *)
           RuleBuilder::start((RuleBuilder *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              in_stack_ffffffffffffff64);
      in_stack_ffffffffffffff6c =
           ProgramReader::matchAtom
                     (in_stack_ffffffffffffff40,
                      (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      RuleBuilder::addHead((RuleBuilder *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      matchSum(in_stack_ffffffffffffff70,
               (RuleBuilder *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               SUB41(in_stack_ffffffffffffff64.val_ >> 0x18,0));
      RuleBuilder::end(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      goto LAB_00265df4;
    }
    Head_t::Head_t(&local_44,Disjunctive);
    RuleBuilder::start((RuleBuilder *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                       in_stack_ffffffffffffff64);
    ProgramReader::matchAtom
              (in_stack_ffffffffffffff40,
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    RuleBuilder::addHead((RuleBuilder *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    matchBody(in_stack_ffffffffffffff50,
              (RuleBuilder *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    RuleBuilder::end(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  } while( true );
}

Assistant:

bool SmodelsInput::readRules() {
	RuleBuilder rule;
	Weight_t minPrio = 0;
	for (unsigned rt; (rt = matchPos("rule type expected")) != 0;) {
		rule.clear();
		switch (rt) {
			default: return require(false, "unrecognized rule type");
			case Choice: case Disjunctive: // n a1..an
				rule.start(rt == Choice ? Head_t::Choice : Head_t::Disjunctive);
				for (unsigned i = matchAtom("positive head size expected"); i--;) { rule.addHead(matchAtom()); }
				matchBody(rule);
				rule.end(&out_);
				break;
			case Basic:
				rule.start(Head_t::Disjunctive).addHead(matchAtom());
				matchBody(rule);
				rule.end(&out_);
				break;
			case Cardinality: // fall through
			case Weight:      // fall through
				rule.start(Head_t::Disjunctive).addHead(matchAtom());
				matchSum(rule, rt == Weight);
				rule.end(&out_);
				break;
			case Optimize:
				rule.startMinimize(minPrio++);
				matchSum(rule, true);
				rule.end(&out_);
				break;
			case ClaspIncrement:
				require(opts_.claspExt && matchPos() == 0, "unrecognized rule type");
				break;
			case ClaspAssignExt:
			case ClaspReleaseExt:
				require(opts_.claspExt, "unrecognized rule type");
				if (rt == ClaspAssignExt) {
					Atom_t rHead = matchAtom();
					out_.external(rHead, static_cast<Value_t>((matchPos(2, "0..2 expected") ^ 3) - 1));
				}
				else {
					out_.external(matchAtom(), Value_t::Release);
				}
				break;
		}
	}
	return true;
}